

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweeper.c
# Opt level: O0

void Gia_ManCollectSuper_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vSuper)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Vec_Int_t *vSuper_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_IsComplement(pObj);
  if ((((iVar1 == 0) && ((*(ulong *)pObj >> 0x3e & 1) == 0)) &&
      (iVar1 = Gia_ObjIsCi(pObj), iVar1 == 0)) && (iVar1 = Gia_ObjIsMuxType(pObj), iVar1 == 0)) {
    pGVar2 = Gia_ObjChild0(pObj);
    Gia_ManCollectSuper_rec(p,pGVar2,vSuper);
    pGVar2 = Gia_ObjChild1(pObj);
    Gia_ManCollectSuper_rec(p,pGVar2,vSuper);
    return;
  }
  iVar1 = Gia_Obj2Lit(p,pObj);
  Vec_IntPushUnique(vSuper,iVar1);
  return;
}

Assistant:

static void Gia_ManCollectSuper_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vSuper )
{
    // stop at complements, shared, PIs, and MUXes
    if ( Gia_IsComplement(pObj) || pObj->fMark1 || Gia_ObjIsCi(pObj) || Gia_ObjIsMuxType(pObj) )
    {
        Vec_IntPushUnique( vSuper, Gia_Obj2Lit(p, pObj) );
        return;
    }
    Gia_ManCollectSuper_rec( p, Gia_ObjChild0(pObj), vSuper );
    Gia_ManCollectSuper_rec( p, Gia_ObjChild1(pObj), vSuper );
}